

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<float>::TPZFMatrix
          (TPZFMatrix<float> *this,int64_t rows,int64_t cols,float *buf,int64_t sz)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  TPZRegisterClassId *in_RDI;
  long in_R8;
  int64_t size;
  char *in_stack_00000148;
  char *in_stack_00000150;
  int64_t in_stack_ffffffffffffff98;
  void **in_stack_ffffffffffffffa8;
  TPZManVector<int,_5> *in_stack_ffffffffffffffb0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<float>>(in_RDI,0x21);
  TPZMatrix<float>::TPZMatrix
            ((TPZMatrix<float> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int64_t)in_RDI
             ,in_stack_ffffffffffffff98);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023ddb30;
  *(undefined8 *)(in_RDI + 0x20) = in_RCX;
  *(undefined8 *)(in_RDI + 0x28) = in_RCX;
  *(long *)(in_RDI + 0x30) = in_R8;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffffb0,(int64_t)(in_RDI + 0x38));
  TPZVec<float>::TPZVec((TPZVec<float> *)(in_RDI + 0x70));
  uVar2 = in_RSI * in_RDX;
  if (uVar2 == 0) {
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  else if (in_R8 < (long)uVar2) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(in_RDI + 0x20) = pvVar4;
    if ((*(long *)(in_RDI + 0x20) == 0) && (uVar2 != 0)) {
      Error(in_stack_00000150,in_stack_00000148);
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,TVar * buf,const int64_t sz)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),TPZMatrix<TVar>( rows, cols ), 
fElem(buf),fGiven(buf),fSize(sz) {
    int64_t size = rows * cols;
    if(size == 0)
    {
        fElem = NULL;
    }
    else if(size > sz)
    {
        fElem=new TVar[size];
#ifndef PZNODEBUG
        if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    }
}